

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

DWORD SuperFastHash(char *data,size_t len)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  if (data == (char *)0x0 || len == 0) {
    return 0;
  }
  uVar3 = 0;
  if (3 < len) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = (*(ushort *)(data + uVar2 * 4) + uVar3) * 0x10000 ^
              (uint)*(ushort *)(data + uVar2 * 4 + 2) << 0xb ^ *(ushort *)(data + uVar2 * 4) + uVar3
      ;
      uVar3 = (uVar3 >> 0xb) + uVar3;
      uVar2 = uVar2 + 1;
    } while (len >> 2 != uVar2);
    data = data + (len & 0xfffffffffffffffc);
  }
  switch((uint)len & 3) {
  case 0:
    goto switchD_004aa255_caseD_0;
  case 1:
    uVar3 = uVar3 + (int)(char)*(ushort *)data;
    uVar1 = uVar3 * 0x400 ^ uVar3;
    uVar3 = uVar1 >> 1;
    break;
  case 2:
    uVar1 = (uVar3 + *(ushort *)data) * 0x800 ^ uVar3 + *(ushort *)data;
    uVar3 = uVar1 >> 0x11;
    break;
  case 3:
    uVar3 = (uVar3 + *(ushort *)data) * 0x10000 ^
            (int)(char)*(ushort *)((long)data + 2) << 0x12 ^ uVar3 + *(ushort *)data;
    uVar3 = (uVar3 >> 0xb) + uVar3;
    goto switchD_004aa255_caseD_0;
  }
  uVar3 = uVar3 + uVar1;
switchD_004aa255_caseD_0:
  uVar3 = uVar3 * 8 ^ uVar3;
  uVar3 = (uVar3 >> 5) + uVar3;
  uVar3 = uVar3 * 0x10 ^ uVar3;
  uVar3 = (uVar3 >> 0x11) + uVar3;
  uVar3 = uVar3 * 0x2000000 ^ uVar3;
  return (uVar3 >> 6) + uVar3;
}

Assistant:

DWORD SuperFastHash (const char *data, size_t len)
{
	DWORD hash = 0, tmp;
	size_t rem;

	if (len == 0 || data == NULL) return 0;

	rem = len & 3;
	len >>= 2;

	/* Main loop */
	for (;len > 0; len--)
	{
		hash  += get16bits (data);
		tmp    = (get16bits (data+2) << 11) ^ hash;
		hash   = (hash << 16) ^ tmp;
		data  += 2*sizeof (WORD);
		hash  += hash >> 11;
	}

	/* Handle end cases */
	switch (rem)
	{
		case 3:	hash += get16bits (data);
				hash ^= hash << 16;
				hash ^= data[sizeof (WORD)] << 18;
				hash += hash >> 11;
				break;
		case 2:	hash += get16bits (data);
				hash ^= hash << 11;
				hash += hash >> 17;
				break;
		case 1: hash += *data;
				hash ^= hash << 10;
				hash += hash >> 1;
	}

	/* Force "avalanching" of final 127 bits */
	hash ^= hash << 3;
	hash += hash >> 5;
	hash ^= hash << 4;
	hash += hash >> 17;
	hash ^= hash << 25;
	hash += hash >> 6;

	return hash;
}